

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<ProKey,QMakeInternal::QMakeBuiltin>::emplace<QMakeInternal::QMakeBuiltin_const&>
          (QHash<ProKey,QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  QArrayData *pQVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QMakeBuiltin local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QArrayData **)this;
  if (pQVar1 == (QArrayData *)0x0) {
LAB_0026f466:
    pDVar3 = *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this;
    local_50.usage.d.d = (Data *)pQVar1;
    if ((pDVar3 == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0) ||
       (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::
               detached(pDVar3);
      *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this = pDVar3;
    }
    pVar4 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::~QHash
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)&local_50);
  }
  else {
    if (1 < (uint)(pQVar1->ref_)._q_value.super___atomic_base<int>._M_i) {
      if ((pQVar1 != (QArrayData *)0x0) &&
         ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0026f466;
    }
    uVar2._0_4_ = pQVar1[1].ref_;
    uVar2._4_4_ = pQVar1[1].flags;
    if ((ulong)pQVar1->alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar4 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
        return (iterator)pVar4;
      }
      goto LAB_0026f539;
    }
    local_50.usage.d.d = (args->usage).d.d;
    local_50.usage.d.ptr = (args->usage).d.ptr;
    local_50.usage.d.size = (args->usage).d.size;
    if (&(local_50.usage.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.usage.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.usage.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.maxArgs = args->maxArgs;
    local_50.index = args->index;
    local_50.minArgs = args->minArgs;
    pVar4 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::
                   emplace_helper<QMakeInternal::QMakeBuiltin>
                             ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)this,key,&local_50);
    if (&(local_50.usage.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.usage.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.usage.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.usage.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.usage.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar4;
  }
LAB_0026f539:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }